

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::CombinedImageSamplerHandler::handle
          (CombinedImageSamplerHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  Compiler *pCVar1;
  anon_class_8_2_a61a8770_for__M_pred __pred;
  SPIRFunction *caller;
  bool bVar2;
  uint32_t uVar3;
  CompilerError *pCVar4;
  reference ppSVar5;
  CombinedImageSampler *pCVar6;
  CombinedImageSampler *pCVar7;
  SPIRType *pSVar8;
  bool local_239;
  bool local_221;
  uint32_t local_20c;
  uint32_t local_1fc;
  bool local_1ca;
  bool local_1c9;
  CombinedImageSampler local_1b4;
  SPIRType *local_1a8;
  SPIRType *parent_type;
  SPIRVariable *var_1;
  ID local_190;
  ID local_18c;
  bool local_185;
  int local_184;
  StorageClass SStack_180;
  bool relaxed_precision;
  TypedID<(spirv_cross::Types)1> local_17c;
  SPIRType *local_178;
  SPIRType *base;
  SPIRType *type_3;
  uint32_t combined_id_1;
  uint32_t type_id;
  uint32_t id_2;
  SPIRType *type_4;
  uint32_t combined_module_id;
  uint32_t sampled_type;
  CombinedImageSampler *local_140;
  CombinedImageSampler *itr;
  VariableID local_130;
  VariableID sampler_id;
  VariableID image_id;
  VariableID local_124;
  SPIRType *local_120;
  SPIRType *combined_type;
  SPIRVariable *pSStack_110;
  uint32_t combined_id;
  SPIRVariable *sampler;
  SPIRVariable *pSStack_100;
  uint32_t sampler_id_1;
  SPIRVariable *image;
  value_type pSStack_f0;
  uint32_t image_id_1;
  SPIRFunction *callee;
  string local_e0 [32];
  SPIRType *local_c0;
  SPIRType *type_2;
  SPIRVariable *var;
  uint32_t local_a8;
  uint32_t local_a4;
  uint32_t ptr_1;
  uint32_t id_1;
  allocator local_89;
  string local_88 [38];
  undefined1 local_62;
  bool local_61;
  bool separate_sampler_1;
  SPIRType *pSStack_60;
  bool separate_image_1;
  SPIRType *type_1;
  bool local_4d;
  uint32_t result_type_1;
  uint32_t local_48;
  uint32_t ptr;
  uint32_t id;
  bool separate_sampler;
  bool separate_image;
  SPIRType *type;
  byte local_2d;
  uint32_t result_type;
  bool is_fetch;
  uint32_t *puStack_28;
  uint32_t length_local;
  uint32_t *args_local;
  CombinedImageSamplerHandler *pCStack_18;
  Op opcode_local;
  CombinedImageSamplerHandler *this_local;
  
  local_2d = 0;
  result_type = length;
  puStack_28 = args;
  args_local._4_4_ = opcode;
  pCStack_18 = this;
  switch(opcode) {
  case OpLoad:
    if (length < 3) {
      this_local._7_1_ = false;
    }
    else {
      type._4_4_ = *args;
      _id = get<spirv_cross::SPIRType>(this->compiler,type._4_4_);
      local_1c9 = false;
      if (*(int *)&(_id->super_IVariant).field_0xc == 0x10) {
        local_1c9 = (_id->image).sampled == 1;
      }
      ptr._3_1_ = local_1c9;
      ptr._2_1_ = *(int *)&(_id->super_IVariant).field_0xc == 0x12;
      if ((local_1c9 != false) || ((bool)ptr._2_1_)) {
        local_48 = puStack_28[1];
        result_type_1 = puStack_28[2];
        local_4d = true;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,local_48,(char (*) [1])0x5df766,(uint *)((long)&type + 4),
                   &local_4d);
        register_read(this->compiler,local_48,result_type_1,true);
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = true;
      }
    }
    break;
  default:
    this_local._7_1_ = true;
    break;
  case OpAccessChain:
  case OpInBoundsAccessChain:
  case OpPtrAccessChain:
    if (length < 3) {
      this_local._7_1_ = false;
    }
    else {
      type_1._4_4_ = *args;
      pSStack_60 = get<spirv_cross::SPIRType>(this->compiler,type_1._4_4_);
      local_1ca = false;
      if (*(int *)&(pSStack_60->super_IVariant).field_0xc == 0x10) {
        local_1ca = (pSStack_60->image).sampled == 1;
      }
      local_61 = local_1ca;
      local_62 = *(int *)&(pSStack_60->super_IVariant).field_0xc == 0x12;
      if ((bool)local_62) {
        ptr_1._3_1_ = 1;
        pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_88,
                   "Attempting to use arrays or structs of separate samplers. This is not possible to statically remap to plain GLSL."
                   ,&local_89);
        CompilerError::CompilerError(pCVar4,(string *)local_88);
        ptr_1._3_1_ = 0;
        __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (local_1ca != false) {
        local_a4 = puStack_28[1];
        local_a8 = puStack_28[2];
        var._7_1_ = 1;
        set<spirv_cross::SPIRExpression,char_const(&)[1],unsigned_int&,bool>
                  (this->compiler,local_a4,(char (*) [1])0x5df766,(uint *)((long)&type_1 + 4),
                   (bool *)((long)&var + 7));
        register_read(this->compiler,local_a4,local_a8,true);
      }
      this_local._7_1_ = true;
    }
    break;
  case OpSampledImage:
    goto LAB_005939cf;
  case OpImageFetch:
  case OpImageQuerySizeLod:
  case OpImageQuerySize:
  case OpImageQueryLevels:
  case OpImageQuerySamples:
    type_2 = (SPIRType *)maybe_get_backing_variable(this->compiler,args[2]);
    if (type_2 == (SPIRType *)0x0) {
      return true;
    }
    pCVar1 = this->compiler;
    uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_2->super_IVariant).field_0xc);
    local_c0 = get<spirv_cross::SPIRType>(pCVar1,uVar3);
    if (((*(int *)&(local_c0->super_IVariant).field_0xc != 0x10) || ((local_c0->image).sampled != 1)
        ) || ((local_c0->image).dim == DimBuffer)) {
      return true;
    }
    if (this->compiler->dummy_sampler_id == 0) {
      callee._6_1_ = 1;
      pCVar4 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_e0,
                 "texelFetch without sampler was found, but no dummy sampler has been created with build_dummy_sampler_for_combined_images()."
                 ,(allocator *)((long)&callee + 7));
      CompilerError::CompilerError(pCVar4,(string *)local_e0);
      callee._6_1_ = 0;
      __cxa_throw(pCVar4,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_2d = 1;
LAB_005939cf:
    bVar2 = ::std::
            stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
            ::empty(&this->functions);
    if (!bVar2) {
      ppSVar5 = ::std::
                stack<spirv_cross::SPIRFunction_*,_std::deque<spirv_cross::SPIRFunction_*,_std::allocator<spirv_cross::SPIRFunction_*>_>_>
                ::top(&this->functions);
      pSStack_f0 = *ppSVar5;
      if ((pSStack_f0->do_combined_parameters & 1U) != 0) {
        image._4_4_ = puStack_28[2];
        pSStack_100 = maybe_get_backing_variable(this->compiler,image._4_4_);
        if (pSStack_100 != (SPIRVariable *)0x0) {
          image._4_4_ = TypedID::operator_cast_to_unsigned_int
                                  ((TypedID *)&(pSStack_100->super_IVariant).self);
        }
        if ((local_2d & 1) == 0) {
          local_1fc = puStack_28[3];
        }
        else {
          local_1fc = this->compiler->dummy_sampler_id;
        }
        sampler._4_4_ = local_1fc;
        pSStack_110 = maybe_get_backing_variable(this->compiler,local_1fc);
        if (pSStack_110 != (SPIRVariable *)0x0) {
          sampler._4_4_ =
               TypedID::operator_cast_to_unsigned_int
                         ((TypedID *)&(pSStack_110->super_IVariant).self);
        }
        combined_type._4_4_ = puStack_28[1];
        local_120 = get<spirv_cross::SPIRType>(this->compiler,*puStack_28);
        caller = pSStack_f0;
        TypedID<(spirv_cross::Types)2>::TypedID(&local_124,combined_type._4_4_);
        TypedID<(spirv_cross::Types)2>::TypedID(&image_id,image._4_4_);
        TypedID<(spirv_cross::Types)2>::TypedID(&sampler_id,sampler._4_4_);
        register_combined_image_sampler
                  (this,caller,local_124,image_id,sampler_id,(bool)((local_120->image).depth & 1));
      }
    }
    uVar3 = remap_parameter(this,puStack_28[2]);
    TypedID<(spirv_cross::Types)2>::TypedID(&local_130,uVar3);
    if ((local_2d & 1) == 0) {
      local_20c = remap_parameter(this,puStack_28[3]);
    }
    else {
      local_20c = this->compiler->dummy_sampler_id;
    }
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)((long)&itr + 4),local_20c);
    pCVar6 = ::std::begin<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->compiler->combined_image_samplers);
    pCVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->compiler->combined_image_samplers);
    combined_module_id = local_130.id;
    sampled_type = itr._4_4_;
    __pred.sampler_id.id = itr._4_4_;
    __pred.image_id.id = local_130.id;
    pCVar6 = ::std::
             find_if<spirv_cross::CombinedImageSampler*,spirv_cross::Compiler::CombinedImageSamplerHandler::handle(spv::Op,unsigned_int_const*,unsigned_int)::__0>
                       (pCVar6,pCVar7,__pred);
    local_140 = pCVar6;
    pCVar7 = ::std::end<spirv_cross::SmallVector<spirv_cross::CombinedImageSampler,8ul>>
                       (&this->compiler->combined_image_samplers);
    if (pCVar6 == pCVar7) {
      if ((local_2d & 1) == 0) {
        type_4._4_4_ = *puStack_28;
        type_4._0_4_ = puStack_28[1];
      }
      else {
        type_4._4_4_ = ParsedIR::increase_bound_by(&this->compiler->ir,1);
        _id_2 = set<spirv_cross::SPIRType>(this->compiler,type_4._4_4_);
        pSVar8 = expression_type(this->compiler,puStack_28[2]);
        SPIRType::operator=(_id_2,pSVar8);
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&type_id,type_4._4_4_);
        (_id_2->super_IVariant).self.id = type_id;
        *(undefined4 *)&(_id_2->super_IVariant).field_0xc = 0x11;
        (_id_2->image).depth = false;
        type_4._0_4_ = 0;
      }
      type_3._4_4_ = ParsedIR::increase_bound_by(&this->compiler->ir,2);
      type_3._0_4_ = type_3._4_4_ + 1;
      combined_id_1 = type_3._4_4_;
      base = set<spirv_cross::SPIRType>(this->compiler,type_3._4_4_);
      local_178 = get<spirv_cross::SPIRType>(this->compiler,type_4._4_4_);
      SPIRType::operator=(base,local_178);
      base->pointer = true;
      base->storage = StorageClassUniformConstant;
      TypedID<(spirv_cross::Types)1>::TypedID(&local_17c,type_3._4_4_);
      (base->parent_type).id = local_17c.id;
      SStack_180 = StorageClassUniformConstant;
      local_184 = 0;
      set<spirv_cross::SPIRVariable,unsigned_int&,spv::StorageClass,int>
                (this->compiler,(uint32_t)type_3,(uint *)((long)&type_3 + 4),
                 &stack0xfffffffffffffe80,&local_184);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&itr + 4));
      if (uVar3 == 0) {
LAB_00593ed0:
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_130);
        if (uVar3 != 0) {
          pCVar1 = this->compiler;
          TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>(&local_190,&local_130);
          bVar2 = has_decoration(pCVar1,local_190,DecorationRelaxedPrecision);
          local_221 = true;
          if (bVar2) goto LAB_00593f84;
        }
        local_239 = false;
        if ((uint32_t)type_4 != 0) {
          pCVar1 = this->compiler;
          TypedID<(spirv_cross::Types)0>::TypedID
                    ((TypedID<(spirv_cross::Types)0> *)((long)&var_1 + 4),(uint32_t)type_4);
          local_239 = has_decoration(pCVar1,var_1._4_4_,DecorationRelaxedPrecision);
        }
        local_221 = local_239;
      }
      else {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)2>
                  (&local_18c,(TypedID<(spirv_cross::Types)2> *)((long)&itr + 4));
        bVar2 = has_decoration(pCVar1,local_18c,DecorationRelaxedPrecision);
        local_221 = true;
        if (!bVar2) goto LAB_00593ed0;
      }
LAB_00593f84:
      local_185 = local_221;
      if (local_221 != false) {
        pCVar1 = this->compiler;
        TypedID<(spirv_cross::Types)0>::TypedID
                  ((TypedID<(spirv_cross::Types)0> *)&var_1,(uint32_t)type_3);
        set_decoration(pCVar1,var_1._0_4_,DecorationRelaxedPrecision,0);
      }
      pCVar1 = this->compiler;
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_130);
      parent_type = (SPIRType *)maybe_get_backing_variable(pCVar1,uVar3);
      if (parent_type != (SPIRType *)0x0) {
        pCVar1 = this->compiler;
        uVar3 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)&(parent_type->super_IVariant).field_0xc);
        local_1a8 = get<spirv_cross::SPIRType>(pCVar1,uVar3);
        SmallVector<unsigned_int,_8UL>::operator=(&base->array,&local_1a8->array);
        SmallVector<bool,_8UL>::operator=(&base->array_size_literal,&local_1a8->array_size_literal);
      }
      pCVar1 = this->compiler;
      TypedID<(spirv_cross::Types)2>::TypedID(&local_1b4.combined_id,(uint32_t)type_3);
      local_1b4.image_id.id = local_130.id;
      local_1b4.sampler_id.id = itr._4_4_;
      SmallVector<spirv_cross::CombinedImageSampler,_8UL>::push_back
                (&pCVar1->combined_image_samplers,&local_1b4);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::CombinedImageSamplerHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	// We need to figure out where samplers and images are loaded from, so do only the bare bones compilation we need.
	bool is_fetch = false;

	switch (opcode)
	{
	case OpLoad:
	{
		if (length < 3)
			return false;

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;

		// If not separate image or sampler, don't bother.
		if (!separate_image && !separate_sampler)
			return true;

		uint32_t id = args[1];
		uint32_t ptr = args[2];
		compiler.set<SPIRExpression>(id, "", result_type, true);
		compiler.register_read(id, ptr, true);
		return true;
	}

	case OpInBoundsAccessChain:
	case OpAccessChain:
	case OpPtrAccessChain:
	{
		if (length < 3)
			return false;

		// Technically, it is possible to have arrays of textures and arrays of samplers and combine them, but this becomes essentially
		// impossible to implement, since we don't know which concrete sampler we are accessing.
		// One potential way is to create a combinatorial explosion where N textures and M samplers are combined into N * M sampler2Ds,
		// but this seems ridiculously complicated for a problem which is easy to work around.
		// Checking access chains like this assumes we don't have samplers or textures inside uniform structs, but this makes no sense.

		uint32_t result_type = args[0];

		auto &type = compiler.get<SPIRType>(result_type);
		bool separate_image = type.basetype == SPIRType::Image && type.image.sampled == 1;
		bool separate_sampler = type.basetype == SPIRType::Sampler;
		if (separate_sampler)
			SPIRV_CROSS_THROW(
			    "Attempting to use arrays or structs of separate samplers. This is not possible to statically "
			    "remap to plain GLSL.");

		if (separate_image)
		{
			uint32_t id = args[1];
			uint32_t ptr = args[2];
			compiler.set<SPIRExpression>(id, "", result_type, true);
			compiler.register_read(id, ptr, true);
		}
		return true;
	}

	case OpImageFetch:
	case OpImageQuerySizeLod:
	case OpImageQuerySize:
	case OpImageQueryLevels:
	case OpImageQuerySamples:
	{
		// If we are fetching from a plain OpTypeImage or querying LOD, we must pre-combine with our dummy sampler.
		auto *var = compiler.maybe_get_backing_variable(args[2]);
		if (!var)
			return true;

		auto &type = compiler.get<SPIRType>(var->basetype);
		if (type.basetype == SPIRType::Image && type.image.sampled == 1 && type.image.dim != DimBuffer)
		{
			if (compiler.dummy_sampler_id == 0)
				SPIRV_CROSS_THROW("texelFetch without sampler was found, but no dummy sampler has been created with "
				                  "build_dummy_sampler_for_combined_images().");

			// Do it outside.
			is_fetch = true;
			break;
		}

		return true;
	}

	case OpSampledImage:
		// Do it outside.
		break;

	default:
		return true;
	}

	// Registers sampler2D calls used in case they are parameters so
	// that their callees know which combined image samplers to propagate down the call stack.
	if (!functions.empty())
	{
		auto &callee = *functions.top();
		if (callee.do_combined_parameters)
		{
			uint32_t image_id = args[2];

			auto *image = compiler.maybe_get_backing_variable(image_id);
			if (image)
				image_id = image->self;

			uint32_t sampler_id = is_fetch ? compiler.dummy_sampler_id : args[3];
			auto *sampler = compiler.maybe_get_backing_variable(sampler_id);
			if (sampler)
				sampler_id = sampler->self;

			uint32_t combined_id = args[1];

			auto &combined_type = compiler.get<SPIRType>(args[0]);
			register_combined_image_sampler(callee, combined_id, image_id, sampler_id, combined_type.image.depth);
		}
	}

	// For function calls, we need to remap IDs which are function parameters into global variables.
	// This information is statically known from the current place in the call stack.
	// Function parameters are not necessarily pointers, so if we don't have a backing variable, remapping will know
	// which backing variable the image/sample came from.
	VariableID image_id = remap_parameter(args[2]);
	VariableID sampler_id = is_fetch ? compiler.dummy_sampler_id : remap_parameter(args[3]);

	auto itr = find_if(begin(compiler.combined_image_samplers), end(compiler.combined_image_samplers),
	                   [image_id, sampler_id](const CombinedImageSampler &combined) {
		                   return combined.image_id == image_id && combined.sampler_id == sampler_id;
	                   });

	if (itr == end(compiler.combined_image_samplers))
	{
		uint32_t sampled_type;
		uint32_t combined_module_id;
		if (is_fetch)
		{
			// Have to invent the sampled image type.
			sampled_type = compiler.ir.increase_bound_by(1);
			auto &type = compiler.set<SPIRType>(sampled_type);
			type = compiler.expression_type(args[2]);
			type.self = sampled_type;
			type.basetype = SPIRType::SampledImage;
			type.image.depth = false;
			combined_module_id = 0;
		}
		else
		{
			sampled_type = args[0];
			combined_module_id = args[1];
		}

		auto id = compiler.ir.increase_bound_by(2);
		auto type_id = id + 0;
		auto combined_id = id + 1;

		// Make a new type, pointer to OpTypeSampledImage, so we can make a variable of this type.
		// We will probably have this type lying around, but it doesn't hurt to make duplicates for internal purposes.
		auto &type = compiler.set<SPIRType>(type_id);
		auto &base = compiler.get<SPIRType>(sampled_type);
		type = base;
		type.pointer = true;
		type.storage = StorageClassUniformConstant;
		type.parent_type = type_id;

		// Build new variable.
		compiler.set<SPIRVariable>(combined_id, type_id, StorageClassUniformConstant, 0);

		// Inherit RelaxedPrecision (and potentially other useful flags if deemed relevant).
		// If any of OpSampledImage, underlying image or sampler are marked, inherit the decoration.
		bool relaxed_precision =
		    (sampler_id && compiler.has_decoration(sampler_id, DecorationRelaxedPrecision)) ||
		    (image_id && compiler.has_decoration(image_id, DecorationRelaxedPrecision)) ||
		    (combined_module_id && compiler.has_decoration(combined_module_id, DecorationRelaxedPrecision));

		if (relaxed_precision)
			compiler.set_decoration(combined_id, DecorationRelaxedPrecision);

		// Propagate the array type for the original image as well.
		auto *var = compiler.maybe_get_backing_variable(image_id);
		if (var)
		{
			auto &parent_type = compiler.get<SPIRType>(var->basetype);
			type.array = parent_type.array;
			type.array_size_literal = parent_type.array_size_literal;
		}

		compiler.combined_image_samplers.push_back({ combined_id, image_id, sampler_id });
	}

	return true;
}